

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

void ef_print(void *p)

{
  char *pcVar1;
  ulong uVar2;
  
  printf("                    %s  ",*p);
  printf("%04x %c <",(ulong)*(ushort *)((long)p + 10),
         (ulong)((uint)(*(short *)((long)p + 8) == 0x100) * 9 + 99));
  if (*(short *)((long)p + 0xc) != 0) {
    uVar2 = 0;
    do {
      pcVar1 = " ";
      if (uVar2 == 0) {
        pcVar1 = "";
      }
      printf("%s%02x",pcVar1,(ulong)*(byte *)(*(long *)((long)p + 0x10) + uVar2));
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ushort *)((long)p + 0xc));
  }
  puts(">");
  return;
}

Assistant:

static void
ef_print(const void *p) {
    const struct ef *ef = (struct ef *)p;
    int i;

    printf("                    %s  ", ef->name);
    printf("%04x %c <", ef->id, ef->flags == ZIP_FL_LOCAL ? 'l' : 'c');
    for (i = 0; i < ef->size; i++)
	printf("%s%02x", i ? " " : "", ef->data[i]);
    printf(">\n");
}